

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_reparent.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ALLEGRO_BITMAP *pAVar10;
  char *format;
  int iVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  ALLEGRO_EVENT event;
  int local_78;
  undefined8 local_70;
  int local_58;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    cVar1 = al_init_image_addon();
    if (cVar1 == '\0') {
      format = "Failed to init IIO addon.\n";
    }
    else {
      al_init_primitives_addon();
      al_set_new_bitmap_flags(0xc0);
      al_set_new_display_flags(0x10);
      example.display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
      if (example.display == (ALLEGRO_DISPLAY *)0x0) {
        format = "Error creating display.\n";
      }
      else {
        cVar1 = al_install_keyboard();
        if (cVar1 == '\0') {
          format = "Error installing keyboard.\n";
        }
        else {
          example.glyphs[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/font.tga");
          if (example.glyphs[0] == (ALLEGRO_BITMAP *)0x0) {
            format = "Error loading data/font.tga\n";
          }
          else {
            example.glyphs[1] = (ALLEGRO_BITMAP *)al_load_bitmap("data/bmpfont.tga");
            if (example.glyphs[1] != (ALLEGRO_BITMAP *)0x0) {
              bVar12 = false;
              example.sub = (ALLEGRO_BITMAP *)al_create_sub_bitmap(example.glyphs[0],0,0,0x20,0x20);
              uVar6 = al_create_timer(0x3f91111111111111);
              uVar7 = al_create_event_queue();
              uVar8 = al_get_keyboard_event_source();
              al_register_event_source(uVar7,uVar8);
              uVar8 = al_get_timer_event_source(uVar6);
              al_register_event_source(uVar7,uVar8);
              uVar8 = al_get_display_event_source(example.display);
              al_register_event_source(uVar7,uVar8);
              al_start_timer(uVar6);
              bVar9 = true;
              do {
                al_get_display_width(example.display);
                al_get_display_height(example.display);
                if ((bVar9) && (cVar1 = al_is_event_queue_empty(uVar7), cVar1 != '\0')) {
                  al_map_rgb_f(0,0,0);
                  al_clear_to_color();
                  iVar11 = 0;
                  al_draw_bitmap(0,0,example.glyphs[0],0);
                  al_draw_bitmap(0,0x43400000,example.glyphs[1],0);
                  iVar4 = example.p;
                  iVar2 = al_get_bitmap_x(example.sub);
                  iVar3 = al_get_bitmap_y(example.sub);
                  iVar5 = iVar3 + 0xc0;
                  if (iVar4 != 1) {
                    iVar5 = iVar3;
                  }
                  iVar4 = al_get_bitmap_width(example.sub);
                  iVar3 = al_get_bitmap_height(example.sub);
                  uVar14 = 0;
                  uVar13 = al_map_rgba_f(0x3f000000,0,0,0x3f000000);
                  al_draw_filled_rectangle
                            ((float)iVar2,(float)iVar5,(float)(iVar4 + iVar2),(float)(iVar3 + iVar5)
                             ,uVar13,uVar14);
                  dVar15 = 0.0;
                  do {
                    al_draw_scaled_rotated_bitmap
                              (0,0,(float)iVar11,0x43b48000,0x40000000,0x40000000,
                               (float)(dVar15 * 0.7853981633974483 * 0.125),example.sub,0);
                    dVar15 = dVar15 + 1.0;
                    iVar11 = iVar11 + 100;
                  } while (iVar11 != 800);
                  al_flip_display();
                  bVar9 = false;
                }
                al_wait_for_event(uVar7);
                if (local_78 < 0x29) {
                  if (local_78 == 0xb) {
                    if (local_58 == 0x3b) {
                      bVar12 = true;
                    }
                  }
                  else if (local_78 == 0x1e) {
                    iVar5 = example.i + 1;
                    iVar4 = example.i + 4;
                    if (-1 < iVar5) {
                      iVar4 = iVar5;
                    }
                    iVar4 = (iVar4 >> 2) % 0xc4;
                    if (iVar4 < 0x60) {
                      example.p = 0;
                      iVar3 = iVar4 + 0xf;
                      if (-1 < iVar4) {
                        iVar3 = iVar4;
                      }
                      iVar2 = iVar4 % 0x10 << 5;
                      iVar4 = (iVar3 >> 4) << 5;
                      uVar6 = 0x20;
                      uVar8 = 0x20;
                      pAVar10 = example.glyphs[0];
                    }
                    else {
                      example.p = 1;
                      iVar2 = ((iVar4 - 0x60U) % 0x14) * 0x25;
                      iVar4 = ((iVar4 - 0x60U) / 0x14) * 0x21;
                      uVar6 = 0x25;
                      uVar8 = 0x21;
                      pAVar10 = example.glyphs[1];
                    }
                    example.i = iVar5;
                    al_reparent_bitmap(example.sub,pAVar10,iVar2,iVar4,uVar6,uVar8);
                    bVar9 = true;
                  }
                }
                else if (local_78 == 0x29) {
                  al_acknowledge_resize(local_70);
                }
                else if (local_78 == 0x2a) {
                  bVar12 = true;
                }
              } while (!bVar12);
              return 0;
            }
            format = "Error loading data/bmpfont.tga\n";
            example.glyphs[1] = (ALLEGRO_BITMAP *)0x0;
          }
        }
      }
    }
  }
  abort_example(format);
  iVar5 = __cxa_atexit();
  return iVar5;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int w = 800, h = 600;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_primitives_addon();

   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   example.display = al_create_display(w, h);
   if (!example.display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   example.glyphs[0] = al_load_bitmap("data/font.tga");
   if (!example.glyphs[0]) {
      abort_example("Error loading data/font.tga\n");
   }

   example.glyphs[1] = al_load_bitmap("data/bmpfont.tga");
   if (!example.glyphs[1]) {
      abort_example("Error loading data/bmpfont.tga\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(
      example.display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;
      w = al_get_display_width(example.display);
      h = al_get_display_height(example.display);

      if (need_redraw && al_is_event_queue_empty(queue)) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_CHAR:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(event.display.source);
            break;
              
         case ALLEGRO_EVENT_TIMER:
            update();
            need_redraw = true;
            break;
      }
   }

   return 0;
}